

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall TTD::SlabAllocatorBase<0>::~SlabAllocatorBase(SlabAllocatorBase<0> *this)

{
  SlabBlock *pSVar1;
  LargeSlabBlock *pLVar2;
  SlabBlock *buffer;
  LargeSlabBlock *buffer_00;
  
  buffer = this->m_headBlock;
  while (buffer != (SlabBlock *)0x0) {
    pSVar1 = buffer->Previous;
    Memory::HeapAllocator::Free
              (&Memory::HeapAllocator::Instance,buffer,(ulong)this->m_slabBlockSize);
    buffer = pSVar1;
  }
  buffer_00 = this->m_largeBlockList;
  while (buffer_00 != (LargeSlabBlock *)0x0) {
    pLVar2 = buffer_00->Previous;
    Memory::HeapAllocator::Free
              (&Memory::HeapAllocator::Instance,buffer_00,(ulong)buffer_00->TotalBlockSize);
    buffer_00 = pLVar2;
  }
  if (this->m_reserveActiveLargeBlock != (LargeSlabBlock *)0x0) {
    Memory::HeapAllocator::Free
              (&Memory::HeapAllocator::Instance,this->m_reserveActiveLargeBlock,
               (ulong)this->m_reserveActiveBytes);
    this->m_reserveActiveLargeBlock = (LargeSlabBlock *)0x0;
  }
  return;
}

Assistant:

~SlabAllocatorBase()
        {
            SlabBlock* currBlock = this->m_headBlock;
            while (currBlock != nullptr)
            {
                SlabBlock* tmp = currBlock;
                currBlock = currBlock->Previous;

                TT_HEAP_FREE_ARRAY(byte, (byte*)tmp, this->m_slabBlockSize);
            }

            LargeSlabBlock* currLargeBlock = this->m_largeBlockList;
            while (currLargeBlock != nullptr)
            {
                LargeSlabBlock* tmp = currLargeBlock;
                currLargeBlock = currLargeBlock->Previous;

                TT_HEAP_FREE_ARRAY(byte, (byte*)tmp, tmp->TotalBlockSize);
            }

            if (this->m_reserveActiveLargeBlock != nullptr)
            {
                TT_HEAP_FREE_ARRAY(byte, (byte*)this->m_reserveActiveLargeBlock, this->m_reserveActiveBytes);
                this->m_reserveActiveLargeBlock = nullptr;
            }
        }